

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

int recff_bit64_unary(jit_State *J,RecordFFData *rd)

{
  CTypeID k;
  TRef TVar1;
  TRef TVar2;
  jit_State *J_00;
  long in_RSI;
  long in_RDI;
  bool bVar3;
  TRef tr;
  CTypeID id;
  CTState *cts;
  TValue *in_stack_ffffffffffffff88;
  cTValue *in_stack_ffffffffffffff90;
  long lVar4;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint local_44;
  
  J_00 = (jit_State *)(ulong)*(uint *)(in_RDI + -0xb4);
  k = crec_bit64_type((CTState *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff90);
  bVar3 = k != 0;
  if (bVar3) {
    TVar1 = crec_bit64_arg(J_00,(CType *)CONCAT44(k,in_stack_ffffffffffffff98),
                           (TRef)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                           in_stack_ffffffffffffff88);
    *(ushort *)(in_RDI + 0xa4) = (ushort)(*(int *)(in_RSI + 0x10) << 8) | (short)k + 10U;
    *(short *)(in_RDI + 0xa0) = (short)TVar1;
    *(undefined2 *)(in_RDI + 0xa2) = 0;
    TVar1 = lj_opt_fold((jit_State *)CONCAT44(k,TVar1));
    lVar4 = in_RDI;
    TVar2 = lj_ir_kint(J_00,k);
    *(undefined2 *)(lVar4 + 0xa4) = 0x528a;
    *(short *)(lVar4 + 0xa0) = (short)TVar2;
    *(short *)(lVar4 + 0xa2) = (short)TVar1;
    TVar1 = lj_opt_fold((jit_State *)CONCAT44(k,TVar1));
    **(TRef **)(in_RDI + 0x88) = TVar1;
  }
  local_44 = (uint)bVar3;
  return local_44;
}

Assistant:

int LJ_FASTCALL recff_bit64_unary(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID id = crec_bit64_type(cts, &rd->argv[0]);
  if (id) {
    TRef tr = crec_bit64_arg(J, ctype_get(cts, id), J->base[0], &rd->argv[0]);
    tr = emitir(IRT(rd->data, id-CTID_INT64+IRT_I64), tr, 0);
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, id), tr);
    return 1;
  }
  return 0;
}